

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.h
# Opt level: O0

void insertionsort<server::crcinfo,bool(*)(server::crcinfo_const&,server::crcinfo_const&)>
               (crcinfo *start,crcinfo *end,_func_bool_crcinfo_ptr_crcinfo_ptr *fun)

{
  crcinfo cVar1;
  bool bVar2;
  bool local_39;
  crcinfo local_38;
  crcinfo *j;
  crcinfo tmp;
  crcinfo *i;
  _func_bool_crcinfo_ptr_crcinfo_ptr *fun_local;
  crcinfo *end_local;
  crcinfo *start_local;
  
  for (tmp = (crcinfo)(start + 1); (ulong)tmp < end; tmp = (crcinfo)((long)tmp + 8)) {
    bVar2 = (*fun)((crcinfo *)tmp,(crcinfo *)((long)tmp + -8));
    if (bVar2) {
      j = *(crcinfo **)tmp;
      *(undefined8 *)tmp = *(undefined8 *)((long)tmp + -8);
      cVar1 = tmp;
      while( true ) {
        local_38 = (crcinfo)((long)cVar1 + -8);
        local_39 = false;
        if (start < (ulong)local_38) {
          local_39 = (*fun)((crcinfo *)&j,(crcinfo *)((long)cVar1 + -0x10));
        }
        if (local_39 == false) break;
        *(crcinfo *)local_38 = *(crcinfo *)((long)cVar1 + -0x10);
        cVar1 = local_38;
      }
      *(crcinfo **)local_38 = j;
    }
  }
  return;
}

Assistant:

static inline void insertionsort(T *start, T *end, F fun)
{
    for(T *i = start+1; i < end; i++)
    {
        if(fun(*i, i[-1]))
        {
            T tmp = *i;
            *i = i[-1];
            T *j = i-1;
            for(; j > start && fun(tmp, j[-1]); --j)
                *j = j[-1];
            *j = tmp;
        }
    }
    
}